

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::updateValueTime
          (TimeCoordinator *this,Time valueUpdateTime,bool allowRequestSend)

{
  long lVar1;
  bool bVar2;
  Time TVar3;
  
  if ((this->super_BaseTimeCoordinator).executionMode == false) {
    if (valueUpdateTime.internalTimeCode < 0) {
      this->hasInitUpdates = true;
    }
  }
  else {
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
    if (valueUpdateTime.internalTimeCode <= TVar3.internalTimeCode) {
      this->hasIterationData = true;
    }
    lVar1 = (this->time_value).internalTimeCode;
    if (valueUpdateTime.internalTimeCode < lVar1) {
      if (this->iterating == NO_ITERATIONS) {
        TVar3 = getNextPossibleTime(this);
      }
      if (valueUpdateTime.internalTimeCode < TVar3.internalTimeCode) {
        valueUpdateTime.internalTimeCode = TVar3.internalTimeCode;
      }
      (this->time_value).internalTimeCode = valueUpdateTime.internalTimeCode;
      if ((valueUpdateTime.internalTimeCode < lVar1) &&
         ((this->super_BaseTimeCoordinator).disconnected == false)) {
        bVar2 = updateNextExecutionTime(this);
        if (bVar2 && allowRequestSend) {
          sendTimeRequest(this,(GlobalFederateId)0x8831d580);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TimeCoordinator::updateValueTime(Time valueUpdateTime, bool allowRequestSend)
{
    if (!executionMode)  // updates before exec mode
    {
        if (valueUpdateTime < timeZero) {
            hasInitUpdates = true;
        }
        return;
    }
    if (valueUpdateTime <= time_granted) {
        hasIterationData = true;
    }
    if (valueUpdateTime < time_value) {
        auto ptime = time_value;
        if (iterating != IterationRequest::NO_ITERATIONS) {
            time_value = (valueUpdateTime <= time_granted) ? time_granted : valueUpdateTime;
        } else {
            auto nextPossibleTime = getNextPossibleTime();
            if (valueUpdateTime <= nextPossibleTime) {
                time_value = nextPossibleTime;
            } else {
                time_value = valueUpdateTime;
            }
        }
        if (time_value < ptime && !disconnected) {
            if (updateNextExecutionTime()) {
                if (allowRequestSend) {
                    sendTimeRequest(GlobalFederateId{});
                }
            }
        }
    }
}